

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestCompressionF<Counter<unsigned_short,16u>,Counter<unsigned_short,10u>>(int bias)

{
  Counter<unsigned_short,_10U> local_118;
  Counter<unsigned_short,_16U> local_116;
  Counter<unsigned_short,_16U> local_114;
  Counter<unsigned_short,_10U> local_112;
  Counter<unsigned_short,_16U> local_110;
  Counter<unsigned_short,_16U> local_10e;
  int local_10c;
  int iStack_108;
  Counter<unsigned_short,_16U> expanded;
  int delta_1;
  int delta;
  Counter<unsigned_short,_10U> truncatedRecent;
  Counter<unsigned_short,_16U> fullRecent;
  uint recent;
  Counter<unsigned_short,_10U> truncatedOriginal;
  Counter<unsigned_short,_16U> fullOriginal;
  uint original;
  uint range;
  int bias_local;
  Counter<unsigned_short,_16U> local_a4;
  ushort local_a2;
  Counter<unsigned_short,_16U> local_a0;
  ushort local_9e;
  ushort local_9c;
  unsigned_short absDiff_1;
  unsigned_short absDiff;
  unsigned_short recentLow;
  Counter<unsigned_short,_10U> *pCStack_98;
  Counter<unsigned_short,_16U> *local_90;
  Counter<unsigned_short,_16U> *local_88;
  ThisType *result;
  Counter<unsigned_short,_10U> *local_78;
  Counter<unsigned_short,_10U> *local_70;
  Counter<unsigned_short,_10U> *local_68;
  Counter<unsigned_short,_16U> *local_60;
  Counter<unsigned_short,_16U> *local_58;
  Counter<unsigned_short,_16U> *local_50;
  Counter<unsigned_short,_16U> *local_48;
  Counter<unsigned_short,_16U> *local_40;
  Counter<unsigned_short,_16U> *local_38;
  short local_2c;
  ushort local_2a;
  ushort local_28;
  ushort local_26;
  SignedType gapSigned;
  ValueType_conflict1 gapMSB;
  ValueType_conflict1 gap;
  ValueType_conflict1 smallRecent;
  SignedType smallerSigned;
  ValueType_conflict1 smallerMSB;
  Counter<unsigned_short,_16U> *local_18;
  Counter<unsigned_short,_16U> *local_10;
  
  recent = 0;
  do {
    if (0x7ff < recent) {
      return true;
    }
    Counter<unsigned_short,_16U>::Counter(&fullRecent,(unsigned_short)recent);
    Counter<unsigned_short,_10U>::Counter(&truncatedRecent,0);
    Counter<unsigned_short,_10U>::operator=(&truncatedRecent,fullRecent.Value);
    for (delta = 0; (uint)delta < 0x800; delta = delta + 1) {
      Counter<unsigned_short,_16U>::Counter
                ((Counter<unsigned_short,_16U> *)((long)&delta_1 + 2),(unsigned_short)delta);
      Counter<unsigned_short,_10U>::Counter((Counter<unsigned_short,_10U> *)&delta_1,0);
      Counter<unsigned_short,_10U>::operator=
                ((Counter<unsigned_short,_10U> *)&delta_1,delta_1._2_2_);
      if ((uint)delta < recent) {
        iStack_108 = recent - delta;
        if (iStack_108 < 0x200 - bias) {
LAB_001127fa:
          Counter<unsigned_short,_16U>::Counter(&local_110,(ThisType *)((long)&delta_1 + 2));
          Counter<unsigned_short,_10U>::Counter(&local_112,&truncatedRecent);
          local_88 = &local_10e;
          local_90 = &local_110;
          pCStack_98 = &local_112;
          absDiff_1 = (unsigned_short)bias;
          local_68 = &local_112;
          local_58 = &local_110;
          Counter<unsigned_short,_16U>::Counter
                    (&local_10e,local_112.Value | local_110.Value & 0xfc00);
          local_60 = &local_110;
          local_9c = local_110.Value & 0x3ff;
          local_70 = &local_112;
          if (local_9c < local_112.Value) {
            local_78 = &local_112;
            local_9e = local_112.Value - local_9c;
            if ((ushort)(0x200 - absDiff_1) <= local_9e) {
              Counter<unsigned_short,_16U>::Counter(&local_a0,0x400);
              local_48 = &local_10e;
              local_50 = &local_a0;
              local_10e.Value = local_10e.Value - local_a0.Value;
            }
          }
          else {
            result = (ThisType *)&local_112;
            local_a2 = local_9c - local_112.Value;
            if ((ushort)(absDiff_1 + 0x200) < local_a2) {
              Counter<unsigned_short,_16U>::Counter(&local_a4,0x400);
              local_38 = &local_10e;
              local_40 = &local_a4;
              local_10e.Value = local_10e.Value + local_a4.Value;
            }
          }
          if (local_10e.Value != fullRecent.Value) {
            return false;
          }
          if (bias == 0) {
            Counter<unsigned_short,_16U>::Counter(&local_116,(ThisType *)((long)&delta_1 + 2));
            Counter<unsigned_short,_10U>::Counter(&local_118,&truncatedRecent);
            local_10 = &local_114;
            local_18 = &local_116;
            _gap = &local_118;
            gapMSB = local_118.Value & 0x200;
            gapSigned = local_118.Value + gapMSB * -2;
            local_26 = local_116.Value & 0x3ff;
            local_28 = gapSigned - local_26 & 0x3ff;
            local_2a = gapSigned - local_26 & 0x200;
            local_2c = local_28 + local_2a * -2;
            Counter<unsigned_short,_16U>::Counter(&local_114,local_116.Value + local_2c);
            Counter<unsigned_short,_16U>::operator=(&local_10e,&local_114);
            if (local_10e.Value != fullRecent.Value) {
              return false;
            }
          }
        }
      }
      else {
        local_10c = delta - recent;
        if (local_10c <= bias + 0x200) goto LAB_001127fa;
      }
    }
    recent = recent + 1;
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}